

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

void mspace_free(mspace msp,void *mem)

{
  long *plVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong *puVar11;
  long lVar12;
  ulong *puVar13;
  ulong *puVar14;
  long lVar15;
  ulong *puVar16;
  ulong *puVar17;
  ulong *puVar18;
  ulong uVar19;
  size_t __len;
  
  if (mem == (void *)0x0) {
    return;
  }
  puVar14 = (ulong *)((long)mem + -0x10);
  puVar11 = *(ulong **)((long)msp + 0x18);
  if ((puVar14 < puVar11) || (uVar10 = *(ulong *)((long)mem + -8), ((uint)uVar10 & 3) == 1))
  goto LAB_00104191;
  uVar5 = uVar10 & 0xfffffffffffffff8;
  puVar13 = (ulong *)((long)puVar14 + uVar5);
  if ((uVar10 & 1) == 0) {
    uVar6 = *puVar14;
    if ((uVar10 & 2) == 0) {
      __len = uVar5 + uVar6 + 0x20;
      iVar4 = munmap((void *)((long)puVar14 - uVar6),__len);
      if (iVar4 != 0) {
        return;
      }
      *(long *)((long)msp + 0x358) = *(long *)((long)msp + 0x358) - __len;
      return;
    }
    puVar14 = (ulong *)((long)puVar14 - uVar6);
    if (puVar14 < puVar11) goto LAB_00104191;
    uVar5 = uVar5 + uVar6;
    if (puVar14 == *(ulong **)((long)msp + 0x20)) {
      uVar10 = puVar13[1];
      if ((~(uint)uVar10 & 3) == 0) {
        *(ulong *)((long)msp + 8) = uVar5;
        puVar13[1] = uVar10 & 0xfffffffffffffffe;
        puVar14[1] = uVar5 | 1;
        *puVar13 = uVar5;
        return;
      }
    }
    else if (uVar6 < 0x100) {
      puVar9 = (ulong *)puVar14[2];
      puVar16 = (ulong *)puVar14[3];
      puVar17 = (ulong *)((long)msp + (uVar6 >> 3) * 0x10 + 0x48);
      if ((puVar9 != puVar17) && ((puVar9 < puVar11 || ((ulong *)puVar9[3] != puVar14))))
      goto LAB_00104191;
      if (puVar16 == puVar9) {
        bVar7 = (byte)(uVar6 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
      }
      else {
        if ((puVar16 != puVar17) && ((puVar16 < puVar11 || ((ulong *)puVar16[2] != puVar14))))
        goto LAB_00104191;
        puVar9[3] = (ulong)puVar16;
        puVar16[2] = (ulong)puVar9;
      }
    }
    else {
      puVar9 = (ulong *)puVar14[3];
      uVar10 = puVar14[6];
      if (puVar9 == puVar14) {
        if ((ulong *)puVar14[5] == (ulong *)0x0) {
          if ((ulong *)puVar14[4] == (ulong *)0x0) {
            puVar9 = (ulong *)0x0;
            goto LAB_00103cf5;
          }
          puVar16 = (ulong *)puVar14[4];
          puVar17 = puVar14 + 4;
        }
        else {
          puVar16 = (ulong *)puVar14[5];
          puVar17 = puVar14 + 5;
        }
        do {
          do {
            puVar18 = puVar17;
            puVar9 = puVar16;
            puVar16 = (ulong *)puVar9[5];
            puVar17 = puVar9 + 5;
          } while ((ulong *)puVar9[5] != (ulong *)0x0);
          puVar16 = (ulong *)puVar9[4];
          puVar17 = puVar9 + 4;
        } while ((ulong *)puVar9[4] != (ulong *)0x0);
        if (puVar18 < puVar11) goto LAB_00104191;
        *puVar18 = 0;
      }
      else {
        puVar16 = (ulong *)puVar14[2];
        if (((puVar16 < puVar11) || ((ulong *)puVar16[3] != puVar14)) ||
           ((ulong *)puVar9[2] != puVar14)) goto LAB_00104191;
        puVar16[3] = (ulong)puVar9;
        puVar9[2] = (ulong)puVar16;
      }
LAB_00103cf5:
      if (uVar10 != 0) {
        uVar8 = (uint)puVar14[7];
        if (puVar14 == *(ulong **)((long)msp + (ulong)uVar8 * 8 + 600)) {
          *(ulong **)((long)msp + (ulong)uVar8 * 8 + 600) = puVar9;
          if (puVar9 == (ulong *)0x0) {
            bVar7 = (byte)uVar8 & 0x1f;
            *(uint *)((long)msp + 4) =
                 *(uint *)((long)msp + 4) & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
          }
          else {
LAB_00103d37:
            puVar11 = *(ulong **)((long)msp + 0x18);
            if (puVar9 < puVar11) goto LAB_00104191;
            puVar9[6] = uVar10;
            puVar16 = (ulong *)puVar14[4];
            if (puVar16 != (ulong *)0x0) {
              if (puVar16 < puVar11) goto LAB_00104191;
              puVar9[4] = (ulong)puVar16;
              puVar16[6] = (ulong)puVar9;
            }
            uVar10 = puVar14[5];
            if (uVar10 != 0) {
              if (uVar10 < *(ulong *)((long)msp + 0x18)) goto LAB_00104191;
              puVar9[5] = uVar10;
              *(ulong **)(uVar10 + 0x30) = puVar9;
            }
          }
        }
        else {
          if (uVar10 < *(ulong *)((long)msp + 0x18)) goto LAB_00104191;
          *(ulong **)(uVar10 + 0x20 + (ulong)(*(ulong **)(uVar10 + 0x20) != puVar14) * 8) = puVar9;
          if (puVar9 != (ulong *)0x0) goto LAB_00103d37;
        }
      }
    }
  }
  if ((puVar13 <= puVar14) || (uVar10 = puVar13[1], (uVar10 & 1) == 0)) goto LAB_00104191;
  if ((uVar10 & 2) == 0) {
    if (puVar13 == *(ulong **)((long)msp + 0x28)) {
      uVar5 = uVar5 + *(long *)((long)msp + 0x10);
      *(ulong *)((long)msp + 0x10) = uVar5;
      *(ulong **)((long)msp + 0x28) = puVar14;
      puVar14[1] = uVar5 | 1;
      if (puVar14 == *(ulong **)((long)msp + 0x20)) {
        *(undefined8 *)((long)msp + 0x20) = 0;
        *(undefined8 *)((long)msp + 8) = 0;
      }
      if (uVar5 <= *(ulong *)((long)msp + 0x30)) {
        return;
      }
      sys_trim((mstate)msp,0);
      return;
    }
    if (puVar13 == *(ulong **)((long)msp + 0x20)) {
      uVar5 = uVar5 + *(long *)((long)msp + 8);
      *(ulong *)((long)msp + 8) = uVar5;
      *(ulong **)((long)msp + 0x20) = puVar14;
      puVar14[1] = uVar5 | 1;
      *(ulong *)((long)puVar14 + uVar5) = uVar5;
      return;
    }
    if (uVar10 < 0x100) {
      uVar6 = puVar13[2];
      uVar2 = puVar13[3];
      uVar19 = (long)msp + (uVar10 >> 3) * 0x10 + 0x48;
      if ((uVar6 != uVar19) &&
         ((uVar6 < *(ulong *)((long)msp + 0x18) || (*(ulong **)(uVar6 + 0x18) != puVar13))))
      goto LAB_00104191;
      if (uVar2 == uVar6) {
        bVar7 = (byte)(uVar10 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
      }
      else {
        if ((uVar2 != uVar19) &&
           ((uVar2 < *(ulong *)((long)msp + 0x18) || (*(ulong **)(uVar2 + 0x10) != puVar13))))
        goto LAB_00104191;
        *(ulong *)(uVar6 + 0x18) = uVar2;
        *(ulong *)(uVar2 + 0x10) = uVar6;
      }
    }
    else {
      puVar11 = (ulong *)puVar13[3];
      uVar6 = puVar13[6];
      if (puVar11 == puVar13) {
        if ((ulong *)puVar13[5] == (ulong *)0x0) {
          if ((ulong *)puVar13[4] == (ulong *)0x0) {
            puVar11 = (ulong *)0x0;
            goto LAB_001040d6;
          }
          puVar9 = (ulong *)puVar13[4];
          puVar16 = puVar13 + 4;
        }
        else {
          puVar9 = (ulong *)puVar13[5];
          puVar16 = puVar13 + 5;
        }
        do {
          do {
            puVar17 = puVar16;
            puVar11 = puVar9;
            puVar9 = (ulong *)puVar11[5];
            puVar16 = puVar11 + 5;
          } while ((ulong *)puVar11[5] != (ulong *)0x0);
          puVar9 = (ulong *)puVar11[4];
          puVar16 = puVar11 + 4;
        } while ((ulong *)puVar11[4] != (ulong *)0x0);
        if (puVar17 < *(ulong **)((long)msp + 0x18)) goto LAB_00104191;
        *puVar17 = 0;
      }
      else {
        uVar2 = puVar13[2];
        if (((uVar2 < *(ulong *)((long)msp + 0x18)) || (*(ulong **)(uVar2 + 0x18) != puVar13)) ||
           ((ulong *)puVar11[2] != puVar13)) goto LAB_00104191;
        *(ulong **)(uVar2 + 0x18) = puVar11;
        puVar11[2] = uVar2;
      }
LAB_001040d6:
      if (uVar6 != 0) {
        uVar8 = (uint)puVar13[7];
        if (puVar13 == *(ulong **)((long)msp + (ulong)uVar8 * 8 + 600)) {
          *(ulong **)((long)msp + (ulong)uVar8 * 8 + 600) = puVar11;
          if (puVar11 == (ulong *)0x0) {
            bVar7 = (byte)uVar8 & 0x1f;
            *(uint *)((long)msp + 4) =
                 *(uint *)((long)msp + 4) & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
          }
          else {
LAB_00104114:
            puVar9 = *(ulong **)((long)msp + 0x18);
            if (puVar11 < puVar9) goto LAB_00104191;
            puVar11[6] = uVar6;
            puVar16 = (ulong *)puVar13[4];
            if (puVar16 != (ulong *)0x0) {
              if (puVar16 < puVar9) goto LAB_00104191;
              puVar11[4] = (ulong)puVar16;
              puVar16[6] = (ulong)puVar11;
            }
            uVar6 = puVar13[5];
            if (uVar6 != 0) {
              if (uVar6 < *(ulong *)((long)msp + 0x18)) goto LAB_00104191;
              puVar11[5] = uVar6;
              *(ulong **)(uVar6 + 0x30) = puVar11;
            }
          }
        }
        else {
          if (uVar6 < *(ulong *)((long)msp + 0x18)) goto LAB_00104191;
          *(ulong **)(uVar6 + 0x20 + (ulong)(*(ulong **)(uVar6 + 0x20) != puVar13) * 8) = puVar11;
          if (puVar11 != (ulong *)0x0) goto LAB_00104114;
        }
      }
    }
    uVar5 = uVar5 + (uVar10 & 0xfffffffffffffff8);
    puVar14[1] = uVar5 | 1;
    *(ulong *)((long)puVar14 + uVar5) = uVar5;
    if (puVar14 == *(ulong **)((long)msp + 0x20)) {
      *(ulong *)((long)msp + 8) = uVar5;
      return;
    }
  }
  else {
    puVar13[1] = uVar10 & 0xfffffffffffffffe;
    puVar14[1] = uVar5 | 1;
    *(ulong *)((long)puVar14 + uVar5) = uVar5;
  }
  if (uVar5 < 0x100) {
    uVar5 = uVar5 >> 3;
    uVar10 = (long)msp + uVar5 * 0x10 + 0x48;
    if ((*msp >> ((uint)uVar5 & 0x1f) & 1) == 0) {
      *(uint *)msp = *msp | 1 << ((byte)uVar5 & 0x1f);
      uVar6 = uVar10;
    }
    else {
      uVar6 = *(ulong *)((long)msp + uVar5 * 0x10 + 0x58);
      if (uVar6 < *(ulong *)((long)msp + 0x18)) {
LAB_00104191:
        abort();
      }
    }
    *(ulong **)((long)msp + uVar5 * 0x10 + 0x58) = puVar14;
    *(ulong **)(uVar6 + 0x18) = puVar14;
    puVar14[2] = uVar6;
    puVar14[3] = uVar10;
  }
  else {
    uVar8 = (uint)(uVar5 >> 8);
    if (uVar8 == 0) {
      uVar8 = 0;
    }
    else if (uVar8 < 0x10000) {
      uVar3 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar8 = (uint)((uVar5 >> ((ulong)(byte)(0x26 - (char)(uVar3 ^ 0x1f)) & 0x3f) & 1) != 0) +
              (uVar3 ^ 0x1f) * 2 ^ 0x3e;
    }
    else {
      uVar8 = 0x1f;
    }
    puVar11 = (ulong *)((long)msp + (ulong)uVar8 * 8 + 600);
    *(uint *)(puVar14 + 7) = uVar8;
    puVar14[4] = 0;
    puVar14[5] = 0;
    if ((*(uint *)((long)msp + 4) >> (uVar8 & 0x1f) & 1) == 0) {
      *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar8 & 0x1f);
      puVar13 = puVar11;
    }
    else {
      bVar7 = 0x39 - (char)(uVar8 >> 1);
      if (uVar8 == 0x1f) {
        bVar7 = 0;
      }
      lVar12 = uVar5 << (bVar7 & 0x3f);
      puVar11 = (ulong *)*puVar11;
      do {
        puVar9 = puVar11;
        if ((puVar9[1] & 0xfffffffffffffff8) == uVar5) {
          if ((puVar9 < *(ulong **)((long)msp + 0x18)) ||
             (puVar13 = (ulong *)puVar9[2], puVar13 < *(ulong **)((long)msp + 0x18)))
          goto LAB_00104191;
          puVar11 = puVar9 + 2;
          puVar13[3] = (ulong)puVar14;
          lVar12 = 0x30;
          lVar15 = 0x10;
          puVar16 = (ulong *)0x0;
          goto LAB_00104057;
        }
        lVar15 = lVar12 >> 0x3f;
        lVar12 = lVar12 * 2;
        puVar11 = (ulong *)puVar9[4 - lVar15];
      } while ((ulong *)puVar9[4 - lVar15] != (ulong *)0x0);
      puVar11 = puVar9 + (4 - lVar15);
      puVar13 = puVar9;
      if (puVar11 < *(ulong **)((long)msp + 0x18)) goto LAB_00104191;
    }
    lVar15 = 0x30;
    lVar12 = 0x10;
    puVar9 = puVar14;
    puVar16 = puVar14;
LAB_00104057:
    *puVar11 = (ulong)puVar14;
    *(ulong **)((long)puVar14 + lVar15) = puVar13;
    puVar14[3] = (ulong)puVar9;
    *(ulong **)((long)puVar14 + lVar12) = puVar16;
    plVar1 = (long *)((long)msp + 0x38);
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      release_unused_segments((mstate)msp);
      return;
    }
  }
  return;
}

Assistant:

void mspace_free(mspace msp, void* mem) {
  if (mem != 0) {
    mchunkptr p  = mem2chunk(mem);
#if FOOTERS
    mstate fm = get_mstate_for(p);
    (void)msp; /* placate people compiling -Wunused */
#else /* FOOTERS */
    mstate fm = (mstate)msp;
#endif /* FOOTERS */
    if (!ok_magic(fm)) {
      USAGE_ERROR_ACTION(fm, p);
      return;
    }
    if (!PREACTION(fm)) {
      check_inuse_chunk(fm, p);
      if (RTCHECK(ok_address(fm, p) && ok_inuse(p))) {
        size_t psize = chunksize(p);
        mchunkptr next = chunk_plus_offset(p, psize);
        if (!pinuse(p)) {
          size_t prevsize = p->prev_foot;
          if (is_mmapped(p)) {
            psize += prevsize + MMAP_FOOT_PAD;
            if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
              fm->footprint -= psize;
            goto postaction;
          }
          else {
            mchunkptr prev = chunk_minus_offset(p, prevsize);
            psize += prevsize;
            p = prev;
            if (RTCHECK(ok_address(fm, prev))) { /* consolidate backward */
              if (p != fm->dv) {
                unlink_chunk(fm, p, prevsize);
              }
              else if ((next->head & INUSE_BITS) == INUSE_BITS) {
                fm->dvsize = psize;
                set_free_with_pinuse(p, psize, next);
                goto postaction;
              }
            }
            else
              goto erroraction;
          }
        }

        if (RTCHECK(ok_next(p, next) && ok_pinuse(next))) {
          if (!cinuse(next)) {  /* consolidate forward */
            if (next == fm->top) {
              size_t tsize = fm->topsize += psize;
              fm->top = p;
              p->head = tsize | PINUSE_BIT;
              if (p == fm->dv) {
                fm->dv = 0;
                fm->dvsize = 0;
              }
              if (should_trim(fm, tsize))
                sys_trim(fm, 0);
              goto postaction;
            }
            else if (next == fm->dv) {
              size_t dsize = fm->dvsize += psize;
              fm->dv = p;
              set_size_and_pinuse_of_free_chunk(p, dsize);
              goto postaction;
            }
            else {
              size_t nsize = chunksize(next);
              psize += nsize;
              unlink_chunk(fm, next, nsize);
              set_size_and_pinuse_of_free_chunk(p, psize);
              if (p == fm->dv) {
                fm->dvsize = psize;
                goto postaction;
              }
            }
          }
          else
            set_free_with_pinuse(p, psize, next);

          if (is_small(psize)) {
            insert_small_chunk(fm, p, psize);
            check_free_chunk(fm, p);
          }
          else {
            tchunkptr tp = (tchunkptr)p;
            insert_large_chunk(fm, tp, psize);
            check_free_chunk(fm, p);
            if (--fm->release_checks == 0)
              release_unused_segments(fm);
          }
          goto postaction;
        }
      }
    erroraction:
      USAGE_ERROR_ACTION(fm, p);
    postaction:
      POSTACTION(fm);
    }
  }
}